

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O0

void fdump_action(FILE *out,stone_type stone,response_cache_element *resp,int a,char *indent)

{
  uint *puVar1;
  void *__ptr;
  uint in_ECX;
  long in_RDX;
  long in_RSI;
  FILE *in_RDI;
  char *tmp;
  int i;
  proto_action *act;
  void *in_stack_ffffffffffffffa0;
  char *pcVar2;
  int local_34;
  
  if ((in_RDX == 0) || (*(int *)(in_RDX + 0xc) != 0)) {
    puVar1 = (uint *)(*(long *)(in_RSI + 0x50) + (long)(int)in_ECX * 0x60);
    fprintf(in_RDI," Action %d - %s  ",(ulong)in_ECX,action_str[*puVar1]);
    if (puVar1[0x12] == 0) {
      fprintf(in_RDI,"accepts any encode state\n");
    }
    else if (puVar1[0x12] == 1) {
      fprintf(in_RDI,"requires decoded\n");
    }
    else if (puVar1[0x12] == 2) {
      fprintf(in_RDI,"requires contiguous encoded\n");
    }
    else if (puVar1[0x12] == 3) {
      fprintf(in_RDI,"requires vector encoded\n");
    }
    fprintf(in_RDI,"  expects formats ");
    if (*(long *)(puVar1 + 4) == 0) {
      fprintf(in_RDI," NULL");
    }
    else {
      local_34 = 0;
      while (*(long *)(*(long *)(puVar1 + 4) + (long)local_34 * 8) != 0) {
        __ptr = (void *)global_name_of_FMFormat
                                  (*(undefined8 *)(*(long *)(puVar1 + 4) + (long)local_34 * 8));
        fprintf(in_RDI,"\"%s\" (%p), ",__ptr,
                *(undefined8 *)(*(long *)(puVar1 + 4) + (long)local_34 * 8));
        local_34 = local_34 + 1;
        free(__ptr);
      }
    }
    fprintf(in_RDI,"\n");
    switch(*puVar1) {
    case 1:
      if (*(long *)(puVar1 + 10) == 0) {
        pcVar2 = "NULL";
      }
      else {
        pcVar2 = *(char **)(puVar1 + 10);
      }
      fprintf(in_RDI,"  Target: %s: connection %p, remote_stone_id %d\n",pcVar2,
              *(undefined8 *)(puVar1 + 6),(ulong)puVar1[8]);
      if (*(long *)(puVar1 + 6) != 0) {
        fdump_attr_list(in_RDI,*(undefined8 *)(*(long *)(puVar1 + 6) + 0xd0));
      }
      if (puVar1[0xc] != 0) {
        fprintf(in_RDI,"Connection has FAILED!\n");
      }
      break;
    case 2:
      fprintf(in_RDI,"  Target: CManager %p, stone_id %d\n",*(undefined8 *)(puVar1 + 8),
              (ulong)puVar1[6]);
      if (puVar1[10] != 0) {
        fprintf(in_RDI,"TARGET CM HAS SHUTDOWN!\n");
      }
      break;
    case 3:
      break;
    case 4:
      break;
    case 5:
      fprintf(in_RDI,"   Immediate action\n");
      dump_mrd(in_stack_ffffffffffffffa0);
      break;
    case 6:
      fprintf(in_RDI,"   Multi action\n");
      dump_mrd(in_stack_ffffffffffffffa0);
      break;
    case 7:
      fprintf(in_RDI,"   Decoding action\n");
      break;
    default:
      __assert_fail("FALSE",
                    "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp.c"
                    ,0x5c5,
                    "void fdump_action(FILE *, stone_type, response_cache_element *, int, const char *)"
                   );
    case 9:
      fprintf(in_RDI,"    Split action\n");
      break;
    case 10:
      fprintf(in_RDI,"   Store action: %d/%d items\n",(ulong)puVar1[10],(ulong)puVar1[9]);
    case 0:
      fprintf(in_RDI,"   NoAction\n");
    }
  }
  else {
    fprintf(in_RDI,"NO ACTION REGISTERED\n");
  }
  return;
}

Assistant:

static void
fdump_action(FILE* out, stone_type stone, response_cache_element *resp, int a, const char *indent)
{
    proto_action *act;
    (void)indent;
    if ((resp != NULL) && (resp->action_type == Action_NoAction)) {
	fprintf(out, "NO ACTION REGISTERED\n");
	return;
    }
    act = &stone->proto_actions[a];
    fprintf(out, " Action %d - %s  ", a, action_str[act->action_type]);
    if (act->data_state == Accepts_All) {
	fprintf(out, "accepts any encode state\n");
    } else if (act->data_state == Requires_Decoded) {
	fprintf(out, "requires decoded\n");
    } else if (act->data_state == Requires_Contig_Encoded) {
	fprintf(out, "requires contiguous encoded\n");
    } else if (act->data_state == Requires_Vector_Encoded) {
	fprintf(out, "requires vector encoded\n");
    }
    fprintf(out, "  expects formats ");
    if (act->matching_reference_formats) {
	int i = 0;
	while (act->matching_reference_formats[i] != NULL) {
	    char *tmp;
	    fprintf(out, "\"%s\" (%p), ", tmp = global_name_of_FMFormat(act->matching_reference_formats[i]), act->matching_reference_formats[i]);
	    i++;
	    free(tmp);
	}
    } else {
	fprintf(out, " NULL");
    }
    fprintf(out, "\n");
    switch(act->action_type) {
    case Action_Bridge:
	fprintf(out, "  Target: %s: connection %p, remote_stone_id %d\n",
	       (act->o.bri.remote_path ? act->o.bri.remote_path : "NULL" ),
	       (void*)act->o.bri.conn, act->o.bri.remote_stone_id);
	if (act->o.bri.conn != NULL) fdump_attr_list(out, act->o.bri.conn->attrs);
	if (act->o.bri.conn_failed) fprintf(out, "Connection has FAILED!\n");
	break;
    case Action_Thread_Bridge:
	fprintf(out, "  Target: CManager %p, stone_id %d\n",
	       act->o.thr_bri.target_cm, act->o.thr_bri.target_stone_id);
	if (act->o.thr_bri.target_cm_shutdown) fprintf(out, "TARGET CM HAS SHUTDOWN!\n");
	break;
    case Action_Terminal:
	break;
    case Action_Filter:
/*	printf("  Filter proto action number %d\n",
	act->proto_action_id);*/
	break;
    case Action_Decode:
	fprintf(out, "   Decoding action\n");
	break;
    case Action_Split:
	fprintf(out, "    Split action\n");
	break;
    case Action_Immediate: 
	fprintf(out, "   Immediate action\n");
	dump_mrd(act->o.imm.mutable_response_data);
	break;
    case Action_Store:
        fprintf(out, "   Store action: %d/%d items\n", act->o.store.num_stored, 
                    act->o.store.max_stored);
    case Action_NoAction:
	fprintf(out, "   NoAction\n");
	break;
    case Action_Multi:
	fprintf(out, "   Multi action\n");
	dump_mrd(act->o.imm.mutable_response_data);
	break;
    default:
	assert(FALSE);
    }
}